

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

filemgr_dirty_update_node * filemgr_dirty_update_get_latest(filemgr *file)

{
  filemgr_dirty_update_node *pfVar1;
  
  pthread_spin_lock(&file->dirty_update_lock);
  pfVar1 = file->latest_dirty_update;
  if (pfVar1 != (filemgr_dirty_update_node *)0x0) {
    LOCK();
    (pfVar1->ref_count).super___atomic_base<unsigned_int>._M_i =
         (pfVar1->ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  pthread_spin_unlock(&file->dirty_update_lock);
  return pfVar1;
}

Assistant:

struct filemgr_dirty_update_node *filemgr_dirty_update_get_latest(struct filemgr *file)
{
    struct filemgr_dirty_update_node *node = NULL;

    // find the first immutable node from the end
    spin_lock(&file->dirty_update_lock);

    node = file->latest_dirty_update;
    if (node) {
        atomic_incr_uint32_t(&node->ref_count);
    }

    spin_unlock(&file->dirty_update_lock);
    return node;
}